

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.h
# Opt level: O0

void __thiscall
ON_OffsetSurfaceFunction::ON_OffsetSurfaceFunction
          (ON_OffsetSurfaceFunction *this,ON_OffsetSurfaceFunction *param_1)

{
  ON_Surface *pOVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ON_OffsetSurfaceFunction *param_1_local;
  ON_OffsetSurfaceFunction *this_local;
  
  pOVar1 = param_1->m_srf;
  uVar2 = *(undefined8 *)&param_1->field_0x8;
  uVar3 = *(undefined8 *)&param_1->field_0x10;
  uVar4 = *(undefined8 *)&param_1->field_0x18;
  uVar5 = *(undefined4 *)&param_1->field_0x24;
  bVar6 = param_1->m_bZeroSideDerivative[0];
  bVar7 = param_1->m_bZeroSideDerivative[1];
  bVar8 = param_1->m_bZeroSideDerivative[2];
  bVar9 = param_1->m_bZeroSideDerivative[3];
  *(undefined8 *)&this->field_0x1c = *(undefined8 *)&param_1->field_0x1c;
  *(undefined4 *)&this->field_0x24 = uVar5;
  this->m_bZeroSideDerivative[0] = bVar6;
  this->m_bZeroSideDerivative[1] = bVar7;
  this->m_bZeroSideDerivative[2] = bVar8;
  this->m_bZeroSideDerivative[3] = bVar9;
  *(undefined8 *)&this->field_0x10 = uVar3;
  *(undefined8 *)&this->field_0x18 = uVar4;
  this->m_srf = pOVar1;
  *(undefined8 *)&this->field_0x8 = uVar2;
  ON_SimpleArray<ON_OffsetSurfaceValue>::ON_SimpleArray
            (&this->m_offset_value,&param_1->m_offset_value);
  ON_SimpleArray<ON_BumpFunction>::ON_SimpleArray(&this->m_bumps,&param_1->m_bumps);
  this->m_bValid = (bool)(param_1->m_bValid & 1);
  return;
}

Assistant:

class ON_CLASS ON_OffsetSurfaceFunction
{
public:
  ON_OffsetSurfaceFunction();
  ~ON_OffsetSurfaceFunction();

  /*
  Description:
    Sets base surface for the offset function.
  Parameters:
    srf - [in] pointer to the base surface.
               This surface must remain valid while
               the ON_OffsetSurfaceFunction class is used.
  Returns:
    True if successful.
  */
  bool SetBaseSurface(
    const ON_Surface* srf 
    );

  /*
  Returns:
    Base surface specified SetBaseSurface().
  */
  const ON_Surface* BaseSurface() const;

  /*
  Description:
    Use set SetSideTangency if you want the offset 
    surface and base surface to have the same unit
    normals along a side of the surfaces's parameter
    spaces.
  Parameters:
    side - [in]
               0 = south side
               1 = east side
               2 = north side
               3 = west side
    bEnable - [in] true to enable tangency,
                   false to disable tangency
  Returns:
    True if successful.
  */
  bool SetSideTangency(
    int side,
    bool bEnable
    );

  /*
  Parameters:
    side - [in]
               0 = south side
               1 = east side
               2 = north side
               3 = west side
  Returns:
    True if side tangency is enabled.
  */
  bool SideTangency(int side) const;

  /*
  Description:
    Sets the offset distance at a point.  Call this function
    once for each point where the user specifies an offset.
  Parameters:
    s - [in]
    t - [in] (s,t) is a base surface evaluation parameter
    distance - [in] distance is the offset distance.
    radius - [in] if radius>0, then this value will be the
                  the approximate radius of the offset "bump".
  */
  bool SetOffsetPoint(
    double s,
    double t,
    double distance,
    double radius = 0.0
    );

  /*
  Description:
    Sets the surface parameters of an existing offset point.
  Parameters:
    index - [in] index of the point to set
    s - [in]
    t - [in] (s,t) is a base surface evaluation parameter
  */
  bool SetPoint( 
    int index, 
    double s, 
    double t
    );


  /*
  Description: 
    Set the offset distance for an existing point
  Parameters:
    index - [in] index of the point to set
    distance - [in] new distance
  */
  bool SetDistance( 
    int index, 
    double distance);


  /*
  Returns:
    Number of points specified using SetOffsetPoint().
  */
  int OffsetPointCount() const;

  /*
  Parameters:
    i - [in] an index >= 0 and < OffsetPointCount()
  Returns:
    Surface parameter specified using SetOffsetPoint().
  */
  ON_2dPoint OffsetSurfaceParameter(int i) const;

  /*
  Parameters:
    i - [in] an index >= 0 and < OffsetPointCount()
  Returns:
    Offset distance specified using SetOffsetPoint().
  */
  double OffsetDistance(int i) const;

  /*
  Description:
    Value of the offset distance at any surface parameter.
  Parameters:
    s - [in]
    t - [in] (s,t) is a base surface evaluation parameter
  Returns:
    offset distance at the surface parameter
  */
  double DistanceAt(
    double s,
    double t
    ) const;

  /*
  Description:
    Value of the offset distance at any surface parameter.
  Parameters:
    s - [in]
    t - [in] (s,t) is a base surface evaluation parameter
    num_der - [in] number of derivatives
    value - [out] value and derivatives of distance function
                  value[0] = distance, value[1] = 1rst derivative,
                  value[2] = 2nd derivative, ...
  Returns:
    True if successful
  */
  bool EvaluateDistance(
        double s,
        double t,
        int num_der,
        double* value
        ) const;

  /*
  Description:
    Value of the offset function at any surface parameter.
  Parameters:
    s - [in]
    t - [in] (s,t) is a base surface evaluation parameter
  Returns:
    Point on the offset surface.
  */
  ON_3dPoint PointAt(
    double s,
    double t
    ) const;

  /*
  Description:
    Resets this class if you want to reuse it.
  */
  void Destroy();

private:
  friend class ON_OffsetSurface;
  bool Initialize();

  const ON_Surface* m_srf;

  ON_Interval m_domain[2];

  bool m_bZeroSideDerivative[4];   // S,E,N,W side

  ON_SimpleArray<ON_OffsetSurfaceValue> m_offset_value;


  ON_SimpleArray<class ON_BumpFunction> m_bumps;

  bool m_bValid;
}